

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall
ON_RevSurface::GetBBox(ON_RevSurface *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ON_3dPoint *pOVar4;
  double dVar5;
  double dVar6;
  ON_RevSurface *ptr;
  ON_3dVector local_210;
  double local_1f8;
  double dot;
  double dStack_1e8;
  double local_1e0;
  ON_3dPoint local_1d8;
  double local_1c0;
  double t;
  undefined1 auStack_1b0 [4];
  int i;
  double dStack_1a8;
  double local_1a0;
  undefined1 auStack_198 [8];
  ON_Arc arc;
  undefined1 auStack_f8 [8];
  ON_3dPoint P;
  undefined1 local_d0 [8];
  ON_3dPointArray corners;
  ON_BoundingBox abox;
  ON_BoundingBox cbox;
  ON_BoundingBox bbox;
  bool rc;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_RevSurface *this_local;
  
  bbox.m_max.z._6_1_ = ON_BoundingBox::IsValid(&this->m_bbox);
  if (!bbox.m_max.z._6_1_) {
    ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&cbox.m_max.z);
    ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&abox.m_max.z);
    ON_BoundingBox::ON_BoundingBox
              ((ON_BoundingBox *)&corners.super_ON_SimpleArray<ON_3dPoint>.m_count);
    bbox.m_max.z._6_1_ =
         ON_Geometry::GetBoundingBox
                   (&this->m_curve->super_ON_Geometry,(ON_BoundingBox *)&abox.m_max.z,false);
    if (bbox.m_max.z._6_1_) {
      ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)local_d0);
      ON_BoundingBox::GetCorners((ON_BoundingBox *)&abox.m_max.z,(ON_3dPointArray *)local_d0);
      ON_Arc::ON_Arc((ON_Arc *)auStack_198);
      ON_Line::Tangent((ON_3dVector *)auStack_1b0,&this->m_axis);
      arc.super_ON_Circle.plane.zaxis.y = local_1a0;
      arc.super_ON_Circle.plane.yaxis.z = _auStack_1b0;
      arc.super_ON_Circle.plane.zaxis.x = dStack_1a8;
      dVar5 = ON_Interval::operator[](&this->m_angle,1);
      dVar6 = ON_Interval::operator[](&this->m_angle,0);
      ON_Arc::SetAngleRadians((ON_Arc *)auStack_198,dVar5 - dVar6);
      for (t._4_4_ = 0; iVar1 = t._4_4_,
          iVar3 = ON_SimpleArray<ON_3dPoint>::Count((ON_SimpleArray<ON_3dPoint> *)local_d0),
          iVar1 < iVar3; t._4_4_ = t._4_4_ + 1) {
        pOVar4 = ON_SimpleArray<ON_3dPoint>::operator[]
                           ((ON_SimpleArray<ON_3dPoint> *)local_d0,t._4_4_);
        P.y = pOVar4->z;
        auStack_f8 = (undefined1  [8])pOVar4->x;
        P.x = pOVar4->y;
        ON_BoundingBox::Set((ON_BoundingBox *)&corners.super_ON_SimpleArray<ON_3dPoint>.m_count,
                            (ON_3dPoint *)auStack_f8,0);
        bVar2 = ON_Line::ClosestPointTo(&this->m_axis,(ON_3dPoint *)auStack_f8,&local_1c0);
        if (bVar2) {
          ON_Line::PointAt(&local_1d8,&this->m_axis,local_1c0);
          arc.super_ON_Circle.plane.origin.y = local_1d8.z;
          auStack_198 = (undefined1  [8])local_1d8.x;
          arc.super_ON_Circle.plane.origin.x = local_1d8.y;
          ON_3dPoint::operator-
                    ((ON_3dVector *)&dot,(ON_3dPoint *)auStack_f8,(ON_3dPoint *)auStack_198);
          arc.super_ON_Circle.plane.xaxis.y = local_1e0;
          arc.super_ON_Circle.plane.origin.z = dot;
          arc.super_ON_Circle.plane.xaxis.x = dStack_1e8;
          ON_BoundingBox::Set((ON_BoundingBox *)&corners.super_ON_SimpleArray<ON_3dPoint>.m_count,
                              (ON_3dPoint *)auStack_198,1);
          arc.super_ON_Circle.plane.plane_equation.d =
               ON_3dVector::Length((ON_3dVector *)&arc.super_ON_Circle.plane.origin.z);
          bVar2 = ON_3dVector::Unitize((ON_3dVector *)&arc.super_ON_Circle.plane.origin.z);
          if ((bVar2) &&
             (local_1f8 = ON_3dVector::operator*
                                    ((ON_3dVector *)&arc.super_ON_Circle.plane.origin.z,
                                     (ON_3dVector *)&arc.super_ON_Circle.plane.yaxis.z),
             ABS(local_1f8) <= 0.0001)) {
            ON_CrossProduct(&local_210,(ON_3dVector *)&arc.super_ON_Circle.plane.yaxis.z,
                            (ON_3dVector *)&arc.super_ON_Circle.plane.origin.z);
            arc.super_ON_Circle.plane.yaxis.y = local_210.z;
            arc.super_ON_Circle.plane.xaxis.z = local_210.x;
            arc.super_ON_Circle.plane.yaxis.x = local_210.y;
            bVar2 = ON_3dVector::Unitize((ON_3dVector *)&arc.super_ON_Circle.plane.xaxis.z);
            if (bVar2) {
              ON_Plane::UpdateEquation((ON_Plane *)auStack_198);
              dVar5 = ON_Interval::operator[](&this->m_angle,0);
              ON_Plane::Rotate((ON_Plane *)auStack_198,dVar5,
                               (ON_3dVector *)&arc.super_ON_Circle.plane.yaxis.z);
              bVar2 = ON_Arc::IsValid((ON_Arc *)auStack_198);
              if (bVar2) {
                ON_Arc::BoundingBox((ON_BoundingBox *)&ptr,(ON_Arc *)auStack_198);
                memcpy(&corners.super_ON_SimpleArray<ON_3dPoint>.m_count,&ptr,0x30);
              }
            }
          }
        }
        ON_BoundingBox::Union
                  ((ON_BoundingBox *)&cbox.m_max.z,
                   (ON_BoundingBox *)&corners.super_ON_SimpleArray<ON_3dPoint>.m_count);
      }
      bVar2 = ON_BoundingBox::IsValid((ON_BoundingBox *)&cbox.m_max.z);
      if (bVar2) {
        memcpy(&this->m_bbox,&cbox.m_max.z,0x30);
        bbox.m_max.z._6_1_ = true;
      }
      ON_Arc::~ON_Arc((ON_Arc *)auStack_198);
      ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)local_d0);
    }
  }
  if (bbox.m_max.z._6_1_ != false) {
    if (boxmin != (double *)0x0) {
      if (bGrowBox) {
        if ((this->m_bbox).m_min.x < *boxmin) {
          *boxmin = (this->m_bbox).m_min.x;
        }
        if ((this->m_bbox).m_min.y < boxmin[1]) {
          boxmin[1] = (this->m_bbox).m_min.y;
        }
        if ((this->m_bbox).m_min.z < boxmin[2]) {
          boxmin[2] = (this->m_bbox).m_min.z;
        }
      }
      else {
        *boxmin = (this->m_bbox).m_min.x;
        boxmin[1] = (this->m_bbox).m_min.y;
        boxmin[2] = (this->m_bbox).m_min.z;
      }
    }
    if (boxmax != (double *)0x0) {
      if (bGrowBox) {
        dVar5 = (this->m_bbox).m_max.x;
        if (*boxmax <= dVar5 && dVar5 != *boxmax) {
          *boxmax = (this->m_bbox).m_max.x;
        }
        dVar5 = (this->m_bbox).m_max.y;
        if (boxmax[1] <= dVar5 && dVar5 != boxmax[1]) {
          boxmax[1] = (this->m_bbox).m_max.y;
        }
        dVar5 = (this->m_bbox).m_max.z;
        if (boxmax[2] <= dVar5 && dVar5 != boxmax[2]) {
          boxmax[2] = (this->m_bbox).m_max.z;
        }
      }
      else {
        *boxmax = (this->m_bbox).m_max.x;
        boxmax[1] = (this->m_bbox).m_max.y;
        boxmax[2] = (this->m_bbox).m_max.z;
      }
    }
  }
  return bbox.m_max.z._6_1_;
}

Assistant:

bool ON_RevSurface::GetBBox(    // returns true if successful
       double* boxmin,  // boxmin[dim]
       double* boxmax,  // boxmax[dim]
       bool bGrowBox    // true means grow box
       ) const
{
  bool rc = m_bbox.IsValid();

  if ( !rc )
  {
    ON_BoundingBox bbox, cbox, abox;
    rc = m_curve->GetBoundingBox( cbox );
    if (rc)
    {
      //Dec 16 2010 - Chuck - if the angle range does not include 0, m_curve is not part of the surface.
      //bbox = cbox;

      ON_3dPointArray corners;
      cbox.GetCorners(corners);
      ON_3dPoint P;
      ON_Arc arc;
      arc.plane.zaxis = m_axis.Tangent();
      arc.SetAngleRadians(m_angle[1] - m_angle[0]);
      int i;
      double t;
      for ( i = 0; i < corners.Count(); i++ )
      {
        P = corners[i];
        abox.Set(P,false);
        while( m_axis.ClosestPointTo(P,&t) ) // not a loop - used for flow control
        {
          // If we cannot construct a valid arc, then P and the point on the axis
          // are added to the bounding box.  One case where this happens is when
          // P is on the axis of revolution.  See bug 84354.

          arc.plane.origin = m_axis.PointAt(t);
          arc.plane.xaxis = P-arc.plane.origin;
          abox.Set(arc.plane.origin,true);
          arc.radius = arc.plane.xaxis.Length();
          if ( !arc.plane.xaxis.Unitize() )
            break;
          double dot = arc.plane.xaxis*arc.plane.zaxis;
          if ( fabs(dot) > 0.0001 )
            break; 
          arc.plane.yaxis = ON_CrossProduct(arc.plane.zaxis,arc.plane.xaxis);
          if ( !arc.plane.yaxis.Unitize() )
            break;
          arc.plane.UpdateEquation();
          arc.plane.Rotate( m_angle[0], arc.plane.zaxis );
          if ( !arc.IsValid() )
            break;
          abox = arc.BoundingBox();
          break;
        }
        bbox.Union(abox);
      }

      if ( bbox.IsValid() )
      {
        ON_RevSurface* ptr = const_cast<ON_RevSurface*>(this);
        ptr->m_bbox = bbox;
        rc = true;
      }
    }
  }

  if ( rc )
  {
    if ( boxmin )
    {
      if (bGrowBox){
        if (m_bbox.m_min.x < boxmin[0]) boxmin[0] = m_bbox.m_min.x;
        if (m_bbox.m_min.y < boxmin[1]) boxmin[1] = m_bbox.m_min.y;
        if (m_bbox.m_min.z < boxmin[2]) boxmin[2] = m_bbox.m_min.z;
      }
      else {
        boxmin[0] = m_bbox.m_min.x;
        boxmin[1] = m_bbox.m_min.y;
        boxmin[2] = m_bbox.m_min.z;
      }
    }
    if ( boxmax )
    {
      if (bGrowBox){
        if (m_bbox.m_max.x > boxmax[0]) boxmax[0] = m_bbox.m_max.x;
        if (m_bbox.m_max.y > boxmax[1]) boxmax[1] = m_bbox.m_max.y;
        if (m_bbox.m_max.z > boxmax[2]) boxmax[2] = m_bbox.m_max.z;
      }
      else {
        boxmax[0] = m_bbox.m_max.x;
        boxmax[1] = m_bbox.m_max.y;
        boxmax[2] = m_bbox.m_max.z;
      }
    }
  }

  return rc;
}